

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O1

Var Js::JavascriptString::TrimLeftRightHelper<false,true>
              (JavascriptString *arg,ScriptContext *scriptContext)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  char16 *pcVar4;
  undefined4 *puVar5;
  JavascriptString *pJVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  
  TVar1 = arg->m_charLength;
  pcVar4 = GetString(arg);
  uVar7 = TVar1 - 1;
  uVar9 = (ulong)uVar7;
  if (-1 < (int)uVar7) {
    uVar9 = (ulong)uVar7;
    do {
      bVar3 = IsWhiteSpaceCharacter(pcVar4[uVar9]);
      if (!bVar3) goto LAB_00d2d86b;
      bVar3 = 0 < (long)uVar9;
      uVar9 = uVar9 - 1;
    } while (bVar3);
    uVar9 = 0xffffffff;
  }
LAB_00d2d86b:
  uVar8 = (uint)uVar9;
  if (-1 < (int)uVar8) {
    if (uVar8 != uVar7) {
      pJVar6 = SubString::New(arg,0,uVar8 + 1);
      return pJVar6;
    }
    if ((((((arg->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
        super_JavascriptLibraryBase).scriptContext.ptr != scriptContext) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                  ,0x9f4,"(scriptContext == arg->GetScriptContext())",
                                  "Should have already marshaled the string in cross site thunk");
      if (!bVar3) {
LAB_00d2d980:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    return arg;
  }
  if (uVar8 != 0xffffffff) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x9e8,"(idxEnd == -1)","idxEnd == -1");
    if (!bVar3) goto LAB_00d2d980;
    *puVar5 = 0;
  }
  pJVar6 = JavascriptLibrary::GetEmptyString
                     ((scriptContext->super_ScriptContextBase).javascriptLibrary);
  return pJVar6;
}

Assistant:

Var JavascriptString::TrimLeftRightHelper(JavascriptString* arg, ScriptContext* scriptContext)
    {
        static_assert(trimLeft || trimRight, "bad template instance of TrimLeftRightHelper()");

        int len = arg->GetLength();
        const char16 *string = arg->GetString();

        int idxStart = 0;
        if (trimLeft)
        {
            for (; idxStart < len; idxStart++)
            {
                char16 ch = string[idxStart];
                if (IsWhiteSpaceCharacter(ch))
                {
                    continue;
                }
                break;
            }

            if (len == idxStart)
            {
                return (scriptContext->GetLibrary()->GetEmptyString());
            }
        }

        int idxEnd = len - 1;
        if (trimRight)
        {
            for (; idxEnd >= 0; idxEnd--)
            {
                char16 ch = string[idxEnd];
                if (IsWhiteSpaceCharacter(ch))
                {
                    continue;
                }
                break;
            }

            if (!trimLeft)
            {
                if (idxEnd < 0)
                {
                    Assert(idxEnd == -1);
                    return (scriptContext->GetLibrary()->GetEmptyString());
                }
            }
            else
            {
                Assert(idxEnd >= 0);
            }
        }

        if (idxStart == 0 && idxEnd == len - 1)
        {
            AssertMsg(scriptContext == arg->GetScriptContext(), "Should have already marshaled the string in cross site thunk");
            return arg;
        }

        return SubstringCore(arg, idxStart, idxEnd - idxStart + 1, scriptContext);
    }